

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressBlock_opt2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize,
                 ZSTD_dictMode_e dictMode)

{
  undefined8 *puVar1;
  BYTE *pBVar2;
  ZSTD_optimal_t *pZVar3;
  rawSeqStore_t *prVar4;
  undefined8 uVar5;
  seqDef *psVar6;
  uint uVar7;
  int iVar8;
  U32 UVar9;
  U32 UVar10;
  ZSTD_match_t *matches;
  optState_t *optPtr;
  U32 i;
  U32 UVar11;
  U32 UVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  U32 *pUVar16;
  int iVar17;
  ZSTD_optimal_t *pZVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  ZSTD_optimal_t *pZVar24;
  ulong uVar25;
  BYTE *pBVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  ZSTD_optimal_t *pZVar30;
  ulong uVar31;
  bool bVar32;
  U32 nbMatches;
  U32 UStack_144;
  U32 local_140 [2];
  ulong local_138;
  ZSTD_optimal_t *local_130;
  ZSTD_optimal_t *local_128;
  ZSTD_match_t *local_120;
  ZSTD_optimal_t *local_118;
  optState_t *local_110;
  ZSTD_optimal_t *local_108;
  uint local_fc;
  ZSTD_optimal_t *local_f8;
  BYTE *local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  U32 *local_d0;
  ZSTD_optimal_t *local_c8;
  int local_c0;
  U32 nextToUpdate3;
  ZSTD_optimal_t *local_b8;
  ZSTD_optimal_t *local_b0;
  ulong local_a8;
  undefined8 local_a0;
  U32 local_98;
  ZSTD_getAllMatchesFn local_90;
  seqStore_t *local_88;
  ZSTD_optimal_t *local_80;
  ulong local_78;
  BYTE *local_70;
  ZSTD_optLdm_t local_68;
  
  local_110 = &ms->opt;
  local_b0 = (ZSTD_optimal_t *)((long)src + (srcSize - 8));
  uVar13 = (ms->window).dictLimit;
  pBVar2 = (ms->window).base;
  local_d0 = rep;
  local_b8 = (ZSTD_optimal_t *)src;
  local_88 = seqStore;
  local_90 = ZSTD_selectBtGetAllMatches(ms,dictMode);
  local_f8 = local_b8;
  uVar20 = (ms->cParams).targetLength;
  local_fc = 0xfff;
  if (uVar20 < 0xfff) {
    local_fc = uVar20;
  }
  local_138 = CONCAT71(local_138._1_7_,(ms->cParams).minMatch != 3);
  nextToUpdate3 = ms->nextToUpdate;
  local_120 = (ms->opt).matchTable;
  pZVar3 = (ms->opt).priceTable;
  local_a0 = 0;
  local_98 = 0;
  prVar4 = ms->ldmSeqStore;
  if (prVar4 == (rawSeqStore_t *)0x0) {
    local_68.seqStore.posInSequence = 0;
    local_68.seqStore.size = 0;
    local_68.seqStore.seq = (rawSeq *)0x0;
    local_68.seqStore.pos = 0;
    local_68.seqStore.capacity = 0;
  }
  else {
    local_68.seqStore.capacity = prVar4->capacity;
    local_68.seqStore.seq = prVar4->seq;
    local_68.seqStore.pos = prVar4->pos;
    local_68.seqStore.posInSequence = prVar4->posInSequence;
    local_68.seqStore.size = prVar4->size;
  }
  pBVar26 = (BYTE *)((long)local_b8->rep + (srcSize - 0x10));
  local_68.offset = 0;
  local_68.startPosInBlock = 0;
  local_68.endPosInBlock = 0;
  ZSTD_opt_getNextMatchAndUpdateSeqStore(&local_68,0,(U32)srcSize);
  ZSTD_rescaleFreqs(local_110,(BYTE *)local_f8,srcSize,2);
  pZVar18 = (ZSTD_optimal_t *)
            ((long)local_f8->rep + ((ulong)((ZSTD_optimal_t *)(pBVar2 + uVar13) == local_f8) - 0x10)
            );
  if (pZVar18 < local_b0) {
    local_a8 = (ulong)((byte)local_138 + 3);
    local_70 = pBVar26 + -0x20;
    local_78 = (ulong)((byte)local_138 + 3);
    local_130 = pZVar3 + 1;
    local_c0 = 0;
    local_e8 = 0;
    local_e0 = 0;
    local_d8 = 0;
    local_f0 = pBVar26;
    local_80 = local_130;
    do {
      matches = local_120;
      iVar17 = (int)pZVar18;
      local_138 = (ulong)(uint)(iVar17 - (int)local_f8);
      nbMatches = (*local_90)(local_120,ms,&nextToUpdate3,(BYTE *)pZVar18,pBVar26,local_d0,
                              SUB14(iVar17 - (int)local_f8 == 0,0),(U32)local_a8);
      ZSTD_optLdm_processMatchCandidate
                (&local_68,matches,&nbMatches,iVar17 - (int)local_b8,(int)pBVar26 - iVar17);
      uVar31 = local_138;
      local_128 = (ZSTD_optimal_t *)(ulong)nbMatches;
      if (nbMatches == 0) {
        pZVar18 = (ZSTD_optimal_t *)((long)&pZVar18->price + 1);
        uVar25 = 0;
        iVar17 = 2;
      }
      else {
        lVar15 = 0;
        do {
          pZVar3->rep[lVar15] = local_d0[lVar15];
          lVar15 = lVar15 + 1;
        } while (lVar15 != 3);
        pZVar3->mlen = 0;
        UVar12 = (U32)local_138;
        pZVar3->litlen = UVar12;
        local_108 = pZVar18;
        UVar11 = ZSTD_litLengthPrice(UVar12,local_110,2);
        pZVar3->price = UVar11;
        uVar20 = (int)local_128 - 1;
        uVar13 = local_120[uVar20].len;
        if (local_fc < uVar13) {
          local_e8 = (ulong)local_120[uVar20].off;
          uVar25 = (ulong)(uVar13 + UVar12);
          local_130 = (ZSTD_optimal_t *)0x0;
          iVar17 = 7;
          local_d8 = (ulong)uVar13;
          local_e0 = uVar31 & 0xffffffff;
          pZVar18 = local_108;
        }
        else {
          if ((int)UVar11 < 0) {
            __assert_fail("opt[0].price >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x839b,
                          "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                         );
          }
          UVar12 = ZSTD_litLengthPrice(0,local_110,2);
          uVar25 = 1;
          pZVar18 = local_80;
          do {
            pZVar18->price = 0x40000000;
            uVar25 = uVar25 + 1;
            pZVar18 = pZVar18 + 1;
          } while (local_78 != uVar25);
          local_128 = (ZSTD_optimal_t *)(ulong)((int)local_128 + (uint)((int)local_128 == 0));
          pZVar18 = (ZSTD_optimal_t *)0x0;
          do {
            uVar13 = local_120[(long)pZVar18].len;
            local_118 = pZVar18;
            if ((uint)uVar25 <= uVar13) {
              uVar20 = local_120[(long)pZVar18].off;
              uVar23 = 0x1f;
              if (uVar20 != 0) {
                for (; uVar20 >> uVar23 == 0; uVar23 = uVar23 - 1) {
                }
              }
              uVar27 = (uint)uVar25 * 0x100 - 0x200;
              do {
                uVar14 = (uint)uVar25;
                if (uVar14 < 3) {
LAB_0018fe99:
                  __assert_fail("matchLength >= MINMATCH",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0x806c,
                                "U32 ZSTD_getMatchPrice(const U32, const U32, const optState_t *const, const int)"
                               );
                }
                if ((ms->opt).priceType == zop_predef) {
                  uVar21 = 0x1f;
                  if (uVar14 - 2 != 0) {
                    for (; uVar14 - 2 >> uVar21 == 0; uVar21 = uVar21 - 1) {
                    }
                  }
                  if (0x16 < uVar21) goto LAB_0018fe7a;
                  iVar17 = (uVar21 + uVar23) * 0x100 + (uVar27 >> ((byte)uVar21 & 0x1f)) + 0x1000;
                }
                else {
                  uVar28 = (ms->opt).offCodeFreq[uVar23] + 1;
                  uVar21 = 0x1f;
                  if (uVar28 != 0) {
                    for (; uVar28 >> uVar21 == 0; uVar21 = uVar21 - 1) {
                    }
                  }
                  if (0x16 < uVar21) {
LAB_0018fe7a:
                    __assert_fail("hb + BITCOST_ACCURACY < 31",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0x7f60,"U32 ZSTD_fracWeight(U32)");
                  }
                  uVar22 = uVar14 - 3;
                  if (uVar22 < 0x80) {
                    uVar22 = (uint)(byte)(&ZSTD_MLcode_ML_Code)[uVar22];
                  }
                  else {
                    uVar7 = 0x1f;
                    if (uVar22 != 0) {
                      for (; uVar22 >> uVar7 == 0; uVar7 = uVar7 - 1) {
                      }
                    }
                    uVar22 = (uVar7 ^ 0xffffffe0) + 0x44;
                  }
                  uVar29 = (ms->opt).matchLengthFreq[uVar22] + 1;
                  uVar7 = 0x1f;
                  if (uVar29 != 0) {
                    for (; uVar29 >> uVar7 == 0; uVar7 = uVar7 - 1) {
                    }
                  }
                  if (0x16 < uVar7) goto LAB_0018fe7a;
                  iVar17 = ((uVar23 - (uVar21 + uVar7)) + (uint)""[uVar22]) * 0x100 +
                           ((ms->opt).offCodeSumBasePrice -
                           ((uVar28 * 0x100 >> ((byte)uVar21 & 0x1f)) +
                           (uVar29 * 0x100 >> ((byte)uVar7 & 0x1f)))) +
                           (ms->opt).matchLengthSumBasePrice + 0x33;
                  uVar31 = local_138;
                }
                uVar25 = uVar25 & 0xffffffff;
                pZVar3[uVar25].mlen = uVar14;
                pZVar3[uVar25].off = uVar20;
                pZVar3[uVar25].litlen = (U32)uVar31;
                pZVar3[uVar25].price = iVar17 + UVar12 + UVar11;
                uVar25 = (ulong)(uVar14 + 1);
                uVar27 = uVar27 + 0x100;
              } while (uVar14 + 1 <= uVar13);
            }
            pZVar18 = (ZSTD_optimal_t *)((long)&pZVar18->price + 1);
          } while (pZVar18 != local_128);
          uVar25 = (ulong)((int)uVar25 - 1);
          iVar17 = 0;
          pZVar18 = local_108;
        }
      }
      uVar31 = local_e8;
      if (iVar17 == 7) {
LAB_0018fa8d:
        if (pZVar3->mlen != 0) {
          __assert_fail("opt[0].mlen == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x842b,
                        "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                       );
        }
        uVar25 = (ulong)local_130 & 0xffffffff;
        uVar13 = (uint)uVar31;
        if ((U32)local_d8 == 0) {
          local_d0[2] = pZVar3[uVar25].rep[2];
          *(undefined8 *)local_d0 = *(undefined8 *)pZVar3[uVar25].rep;
        }
        else {
          local_140[0] = pZVar3[uVar25].rep[2];
          uVar5 = *(undefined8 *)pZVar3[uVar25].rep;
          nbMatches = (U32)uVar5;
          UStack_144 = (U32)((ulong)uVar5 >> 0x20);
          if (uVar13 < 4) {
            if (uVar13 == 0) {
LAB_0019002c:
              __assert_fail("OFFBASE_IS_REPCODE(offBase)",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x46c3,"void ZSTD_updateRep(U32 *, const U32, const U32)");
            }
            uVar20 = (((U32)local_e0 == 0) + uVar13) - 1;
            UVar11 = nbMatches;
            UVar12 = UStack_144;
            if (uVar20 != 0) {
              if (uVar20 == 3) {
                UVar11 = nbMatches - 1;
              }
              else {
                UVar11 = (&nbMatches)[uVar20];
              }
              pUVar16 = &UStack_144;
              if (uVar20 == 1) {
                pUVar16 = local_140;
              }
              local_140[0] = *pUVar16;
              UStack_144 = nbMatches;
              UVar12 = UStack_144;
            }
          }
          else {
            UVar11 = uVar13 - 3;
            UVar12 = nbMatches;
            local_140[0] = UStack_144;
          }
          UStack_144 = UVar12;
          nbMatches = UVar11;
          *(ulong *)local_d0 = CONCAT44(UStack_144,nbMatches);
          local_d0[2] = local_140[0];
        }
        iVar17 = (int)local_130;
        uVar20 = iVar17 + 1;
        if (0xfff < uVar20) {
          __assert_fail("storeEnd < ZSTD_OPT_NUM",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x843e,
                        "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                       );
        }
        local_c8 = (ZSTD_optimal_t *)(ulong)uVar20;
        pZVar3[(long)local_c8].price = local_c0;
        pZVar3[(long)local_c8].off = uVar13;
        pZVar3[(long)local_c8].mlen = (U32)local_d8;
        pZVar3[(long)local_c8].litlen = (U32)local_e0;
        *(undefined8 *)pZVar3[(long)local_c8].rep = local_a0;
        pZVar3[(long)local_c8].rep[2] = local_98;
        uVar19 = (ulong)local_130 & 0xffffffff;
        uVar25 = (ulong)local_130 & 0xffffffff;
        uVar13 = uVar20;
        if (iVar17 != 0) {
          do {
            uVar23 = (uint)uVar25;
            uVar27 = pZVar3[uVar25].litlen + pZVar3[uVar25].mlen;
            uVar13 = (uint)uVar19;
            pZVar24 = pZVar3 + uVar25;
            iVar8 = pZVar24->price;
            UVar12 = pZVar24->off;
            UVar9 = pZVar24->mlen;
            UVar10 = pZVar24->litlen;
            pZVar24 = pZVar3 + uVar25;
            UVar11 = pZVar24->rep[0];
            uVar5 = *(undefined8 *)(&pZVar24->litlen + 2);
            pZVar30 = pZVar3 + uVar19;
            pZVar30->litlen = pZVar24->litlen;
            pZVar30->rep[0] = UVar11;
            *(undefined8 *)(&pZVar30->litlen + 2) = uVar5;
            pZVar24 = pZVar3 + uVar19;
            pZVar24->price = iVar8;
            pZVar24->off = UVar12;
            pZVar24->mlen = UVar9;
            pZVar24->litlen = UVar10;
            uVar19 = (ulong)(uVar13 - 1);
            uVar25 = (ulong)(uVar23 - uVar27);
            if (uVar27 > uVar23) {
              uVar25 = 0;
            }
          } while (uVar27 <= uVar23 && uVar23 - uVar27 != 0);
        }
        pBVar26 = local_f0;
        pZVar24 = local_f8;
        local_e8 = uVar31;
        if (uVar13 <= uVar20) {
          pZVar30 = (ZSTD_optimal_t *)(ulong)uVar13;
          local_128 = (ZSTD_optimal_t *)(ulong)(iVar17 + 2);
          do {
            uVar13 = pZVar3[(long)pZVar30].litlen;
            uVar31 = (ulong)uVar13;
            uVar20 = pZVar3[(long)pZVar30].mlen;
            if ((ulong)uVar20 == 0) {
              if (pZVar30 != local_c8) {
                __assert_fail("storePos == storeEnd",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x8457,
                              "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                             );
              }
              pZVar18 = (ZSTD_optimal_t *)((long)pZVar24->rep + (uVar31 - 0x10));
            }
            else {
              pBVar2 = (BYTE *)((long)pZVar24->rep + (uVar31 - 0x10));
              if (pBVar26 < pBVar2) {
                __assert_fail("anchor + llen <= iend",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x845c,
                              "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                             );
              }
              local_118 = (ZSTD_optimal_t *)CONCAT44(local_118._4_4_,pZVar3[(long)pZVar30].off);
              local_138 = (ulong)uVar20;
              ZSTD_updateStats(local_110,uVar13,(BYTE *)pZVar24,pZVar3[(long)pZVar30].off,uVar20);
              if (local_88->maxNbSeq <=
                  (ulong)((long)local_88->sequences - (long)local_88->sequencesStart >> 3)) {
                __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x468b,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              if (0x20000 < local_88->maxNbLit) {
                __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x468d,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              pBVar26 = local_88->lit;
              if (local_88->litStart + local_88->maxNbLit < pBVar26 + uVar31) {
                __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x468e,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              if (local_70 < pBVar2) {
                ZSTD_safecopyLiterals(pBVar26,(BYTE *)pZVar24,pBVar2,local_70);
              }
              else {
                uVar5 = *(undefined8 *)&pZVar24->mlen;
                *(undefined8 *)pBVar26 = *(undefined8 *)pZVar24;
                *(undefined8 *)(pBVar26 + 8) = uVar5;
                if (0x10 < uVar13) {
                  pBVar2 = local_88->lit;
                  if ((BYTE *)0xffffffffffffffe0 < pBVar2 + 0x10 + (-0x10 - (long)pZVar24->rep)) {
                    __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0x36a6,
                                  "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                                 );
                  }
                  uVar5 = *(undefined8 *)(pZVar24->rep + 2);
                  *(undefined8 *)(pBVar2 + 0x10) = *(undefined8 *)pZVar24->rep;
                  *(undefined8 *)(pBVar2 + 0x18) = uVar5;
                  if (0x20 < uVar13) {
                    lVar15 = 0;
                    do {
                      puVar1 = (undefined8 *)((long)pZVar24[1].rep + lVar15 + -0xc);
                      uVar5 = puVar1[1];
                      pBVar26 = pBVar2 + lVar15 + 0x20;
                      *(undefined8 *)pBVar26 = *puVar1;
                      *(undefined8 *)(pBVar26 + 8) = uVar5;
                      puVar1 = (undefined8 *)((long)pZVar24[1].rep + lVar15 + 4);
                      uVar5 = puVar1[1];
                      *(undefined8 *)(pBVar26 + 0x10) = *puVar1;
                      *(undefined8 *)(pBVar26 + 0x18) = uVar5;
                      lVar15 = lVar15 + 0x20;
                    } while (pBVar26 + 0x20 < pBVar2 + uVar31);
                  }
                }
              }
              local_88->lit = local_88->lit + uVar31;
              if (0xffff < uVar13) {
                if (local_88->longLengthType != ZSTD_llt_none) {
                  __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0x46a0,
                                "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                               );
                }
                local_88->longLengthType = ZSTD_llt_literalLength;
                local_88->longLengthPos =
                     (U32)((ulong)((long)local_88->sequences - (long)local_88->sequencesStart) >> 3)
                ;
              }
              psVar6 = local_88->sequences;
              psVar6->litLength = (U16)uVar13;
              psVar6->offBase = (U32)local_118;
              if ((uint)local_138 < 3) {
                __assert_fail("matchLength >= MINMATCH",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x46aa,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              if (0xffff < local_138 - 3) {
                if (local_88->longLengthType != ZSTD_llt_none) {
                  __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0x46ad,
                                "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                               );
                }
                local_88->longLengthType = ZSTD_llt_matchLength;
                local_88->longLengthPos =
                     (U32)((ulong)((long)psVar6 - (long)local_88->sequencesStart) >> 3);
              }
              psVar6->mlBase = (U16)(local_138 - 3);
              local_88->sequences = psVar6 + 1;
              pZVar24 = (ZSTD_optimal_t *)
                        ((long)pZVar24->rep + ((ulong)((uint)local_138 + uVar13) - 0x10));
              pBVar26 = local_f0;
              pZVar18 = pZVar24;
            }
            pZVar30 = (ZSTD_optimal_t *)((long)&pZVar30->price + 1);
          } while (pZVar30 != local_128);
        }
        local_f8 = pZVar24;
        ZSTD_setBasePrices(local_110,2);
      }
      else {
        pBVar26 = local_f0;
        if (iVar17 == 0) {
          if ((int)uVar25 != 0) {
            pZVar24 = (ZSTD_optimal_t *)0x1;
            local_108 = pZVar18;
            do {
              optPtr = local_110;
              if (0xfff < (uint)pZVar24) {
                __assert_fail("cur < ZSTD_OPT_NUM",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x83b6,
                              "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                             );
              }
              uVar13 = (uint)pZVar24 - 1;
              local_c8 = pZVar3 + uVar13;
              uVar31 = 1;
              if (pZVar3[uVar13].mlen == 0) {
                uVar31 = (ulong)(local_c8->litlen + 1);
              }
              local_118 = (ZSTD_optimal_t *)((long)pZVar24->rep + (long)(local_108->rep + -8));
              local_138 = CONCAT44(local_138._4_4_,local_c8->price);
              local_130 = pZVar24;
              UVar11 = ZSTD_rawLiteralsCost
                                 ((BYTE *)((long)local_118[-1].rep + 0xb),(U32)local_110,
                                  (optState_t *)0x2,local_c8->price);
              local_128 = (ZSTD_optimal_t *)CONCAT44(local_128._4_4_,UVar11);
              UVar11 = ZSTD_litLengthPrice((U32)uVar31,optPtr,2);
              iVar17 = UVar11 + (int)local_128 + (U32)local_138;
              local_138 = uVar31;
              UVar11 = ZSTD_litLengthPrice((U32)uVar31 - 1,optPtr,2);
              uVar31 = local_138;
              iVar17 = iVar17 - UVar11;
              if (999999999 < iVar17) {
                __assert_fail("price < 1000000000",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x83bf,
                              "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                             );
              }
              pZVar18 = pZVar3 + (long)pZVar24;
              if (iVar17 <= pZVar3[(long)pZVar24].price) {
                pZVar18->off = 0;
                pZVar18->mlen = 0;
                pZVar18->litlen = (U32)local_138;
                pZVar18->price = iVar17;
              }
              uVar13 = pZVar18->mlen;
              uVar20 = (uint)local_130;
              if (uVar20 < uVar13) {
                __assert_fail("cur >= opt[cur].mlen",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x83d5,
                              "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                             );
              }
              if (uVar13 == 0) {
                pZVar18->rep[2] = local_c8->rep[2];
                *(undefined8 *)pZVar18->rep = *(undefined8 *)local_c8->rep;
              }
              else {
                uVar23 = pZVar18->off;
                local_140[0] = pZVar3[uVar20 - uVar13].rep[2];
                nbMatches = (U32)*(undefined8 *)pZVar3[uVar20 - uVar13].rep;
                UStack_144 = (U32)((ulong)*(undefined8 *)pZVar3[uVar20 - uVar13].rep >> 0x20);
                if (uVar23 < 4) {
                  if (uVar23 == 0) goto LAB_0019002c;
                  uVar13 = (uVar23 + (pZVar18->litlen == 0)) - 1;
                  UVar11 = nbMatches;
                  UVar12 = UStack_144;
                  if (uVar13 != 0) {
                    if (uVar13 == 3) {
                      UVar11 = nbMatches - 1;
                    }
                    else {
                      UVar11 = (&nbMatches)[uVar13];
                    }
                    pUVar16 = &UStack_144;
                    if (uVar13 == 1) {
                      pUVar16 = local_140;
                    }
                    local_140[0] = *pUVar16;
                    UStack_144 = nbMatches;
                    UVar12 = UStack_144;
                  }
                }
                else {
                  UVar11 = uVar23 - 3;
                  UVar12 = nbMatches;
                  local_140[0] = UStack_144;
                }
                UStack_144 = UVar12;
                nbMatches = UVar11;
                *(ulong *)pZVar18->rep = CONCAT44(UStack_144,nbMatches);
                pZVar18->rep[2] = local_140[0];
              }
              uVar13 = 0x13;
              if ((local_118 <= local_b0) && (uVar13 = 0x11, uVar20 != (uint)uVar25)) {
                if (pZVar18->price < 0) {
                  __assert_fail("opt[cur].price >= 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0x83e9,
                                "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                               );
                }
                local_c8 = (ZSTD_optimal_t *)CONCAT44(local_c8._4_4_,pZVar18->price);
                local_138 = local_138 & 0xffffffff00000000;
                bVar32 = pZVar18->mlen != 0;
                if (!bVar32) {
                  local_138._4_4_ = SUB84(uVar31,4);
                  local_138 = CONCAT44(local_138._4_4_,pZVar18->litlen);
                }
                local_128 = (ZSTD_optimal_t *)(ulong)bVar32;
                UVar11 = ZSTD_litLengthPrice(0,local_110,2);
                pZVar24 = local_118;
                nbMatches = (*local_90)(local_120,ms,&nextToUpdate3,(BYTE *)local_118,local_f0,
                                        pZVar18->rep,(U32)local_128,(U32)local_a8);
                ZSTD_optLdm_processMatchCandidate
                          (&local_68,local_120,&nbMatches,(int)pZVar24 - (int)local_b8,
                           (int)local_f0 - (int)pZVar24);
                if (nbMatches == 0) {
                  uVar13 = 0x13;
                }
                else {
                  uVar20 = local_120[nbMatches - 1].len;
                  bVar32 = 0xfff < (int)local_130 + uVar20;
                  uVar13 = 0;
                  if (bVar32 || local_fc < uVar20) {
                    UVar12 = 0;
                    if (pZVar18->mlen == 0) {
                      UVar12 = pZVar18->litlen;
                    }
                    uVar13 = (int)local_130 - UVar12;
                    uVar25 = (ulong)(uVar20 + (U32)local_138 + uVar13);
                    if (0x1000 < uVar13) {
                      uVar13 = 0;
                    }
                    local_130 = (ZSTD_optimal_t *)(ulong)uVar13;
                    local_e8 = (ulong)local_120[nbMatches - 1].off;
                    uVar13 = 7;
                    local_d8 = (ulong)uVar20;
                    local_e0 = local_138 & 0xffffffff;
                  }
                  if (!bVar32 && local_fc >= uVar20) {
                    local_128 = (ZSTD_optimal_t *)(ulong)(nbMatches + (nbMatches == 0));
                    pZVar18 = (ZSTD_optimal_t *)0x0;
                    do {
                      uVar13 = (uint)local_a8;
                      if (pZVar18 != (ZSTD_optimal_t *)0x0) {
                        uVar13 = local_120[(long)((long)pZVar18[-1].rep + 0xb)].len + 1;
                      }
                      uVar31 = (ulong)local_120[(long)pZVar18].len;
                      local_118 = pZVar18;
                      if (uVar13 <= local_120[(long)pZVar18].len) {
                        uVar20 = local_120[(long)pZVar18].off;
                        uVar23 = 0x1f;
                        if (uVar20 != 0) {
                          for (; uVar20 >> uVar23 == 0; uVar23 = uVar23 - 1) {
                          }
                        }
                        do {
                          if (uVar31 < 3) goto LAB_0018fe99;
                          UVar12 = (U32)uVar31;
                          if ((ms->opt).priceType == zop_predef) {
                            uVar14 = UVar12 - 2;
                            uVar27 = 0x1f;
                            if (uVar14 != 0) {
                              for (; uVar14 >> uVar27 == 0; uVar27 = uVar27 - 1) {
                              }
                            }
                            if (0x16 < uVar27) goto LAB_0018fe7a;
                            iVar17 = (uVar14 * 0x100 >> ((byte)uVar27 & 0x1f)) +
                                     (uVar27 + uVar23) * 0x100 + 0x1000;
                          }
                          else {
                            uVar14 = (ms->opt).offCodeFreq[uVar23] + 1;
                            uVar27 = 0x1f;
                            if (uVar14 != 0) {
                              for (; uVar14 >> uVar27 == 0; uVar27 = uVar27 - 1) {
                              }
                            }
                            if (0x16 < uVar27) goto LAB_0018fe7a;
                            uVar21 = UVar12 - 3;
                            if (uVar21 < 0x80) {
                              uVar21 = (uint)(byte)(&ZSTD_MLcode_ML_Code)[uVar21];
                            }
                            else {
                              uVar28 = 0x1f;
                              if (uVar21 != 0) {
                                for (; uVar21 >> uVar28 == 0; uVar28 = uVar28 - 1) {
                                }
                              }
                              uVar21 = (uVar28 ^ 0xffffffe0) + 0x44;
                            }
                            uVar22 = (ms->opt).matchLengthFreq[uVar21] + 1;
                            uVar28 = 0x1f;
                            if (uVar22 != 0) {
                              for (; uVar22 >> uVar28 == 0; uVar28 = uVar28 - 1) {
                              }
                            }
                            if (0x16 < uVar28) goto LAB_0018fe7a;
                            iVar17 = ((uVar23 - (uVar27 + uVar28)) + (uint)""[uVar21]) * 0x100 +
                                     ((ms->opt).offCodeSumBasePrice -
                                     ((uVar14 * 0x100 >> ((byte)uVar27 & 0x1f)) +
                                     (uVar22 * 0x100 >> ((byte)uVar28 & 0x1f)))) +
                                     (ms->opt).matchLengthSumBasePrice + 0x33;
                          }
                          iVar17 = iVar17 + UVar11 + (int)local_c8;
                          uVar27 = (int)local_130 + UVar12;
                          uVar19 = (ulong)uVar27;
                          if (((uint)uVar25 < uVar27) || (iVar17 < pZVar3[uVar19].price)) {
                            if ((uint)uVar25 < uVar27) {
                              uVar25 = uVar25 & 0xffffffff;
                              pZVar24 = local_80 + uVar25;
                              do {
                                uVar25 = uVar25 + 1;
                                pZVar24->price = 0x40000000;
                                pZVar24 = pZVar24 + 1;
                              } while (uVar25 < uVar19);
                            }
                            pZVar3[uVar19].mlen = UVar12;
                            pZVar3[uVar19].off = uVar20;
                            pZVar3[uVar19].litlen = (U32)local_138;
                            pZVar3[uVar19].price = iVar17;
                          }
                          uVar31 = uVar31 - 1;
                        } while (uVar13 <= (uint)uVar31);
                      }
                      pZVar18 = (ZSTD_optimal_t *)((long)&pZVar18->price + 1);
                    } while (pZVar18 != local_128);
                    uVar13 = 0;
                  }
                }
              }
              pBVar26 = local_f0;
              pZVar18 = local_108;
              if (uVar13 < 0x11) {
                if (uVar13 != 0) {
                  uVar31 = local_e8;
                  if (uVar13 == 7) goto LAB_0018fa8d;
                  goto LAB_0018fe4b;
                }
              }
              else if (uVar13 != 0x13) {
                if (uVar13 != 0x11) goto LAB_0018fe4b;
                break;
              }
              uVar13 = (int)local_130 + 1;
              pZVar24 = (ZSTD_optimal_t *)(ulong)uVar13;
            } while (uVar13 <= (uint)uVar25);
          }
          uVar31 = uVar25 & 0xffffffff;
          local_c0 = pZVar3[uVar31].price;
          local_98 = pZVar3[uVar31].rep[2];
          local_a0 = *(undefined8 *)pZVar3[uVar31].rep;
          local_d8 = (ulong)pZVar3[uVar31].mlen;
          local_e0 = (ulong)pZVar3[uVar31].litlen;
          uVar13 = pZVar3[uVar31].litlen + pZVar3[uVar31].mlen;
          local_130 = (ZSTD_optimal_t *)(ulong)((uint)uVar25 - uVar13);
          if ((uint)uVar25 < uVar13) {
            local_130 = (ZSTD_optimal_t *)0x0;
          }
          uVar31 = (ulong)pZVar3[uVar31].off;
          if (0xfff < (uint)local_130) {
            __assert_fail("cur < ZSTD_OPT_NUM",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x8428,
                          "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                         );
          }
          goto LAB_0018fa8d;
        }
      }
LAB_0018fe4b:
    } while (pZVar18 < local_b0);
  }
  else {
  }
  return (long)pBVar26 - (long)local_f8;
}

Assistant:

static size_t ZSTD_compressBlock_opt2(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        const void* src, size_t srcSize, const ZSTD_dictMode_e dictMode)
{
    return ZSTD_compressBlock_opt_generic(ms, seqStore, rep, src, srcSize, 2 /* optLevel */, dictMode);
}